

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall
cimg_library::CImg<unsigned_short>::CImg
          (CImg<unsigned_short> *this,uint size_x,uint size_y,uint size_z,uint size_c)

{
  uint uVar1;
  void *pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  uint siz;
  
  *(undefined1 *)(in_RDI + 4) = 0;
  uVar1 = in_ESI * in_EDX * in_ECX * in_R8D;
  if (uVar1 == 0) {
    in_RDI[3] = 0;
    in_RDI[2] = 0;
    in_RDI[1] = 0;
    *in_RDI = 0;
    in_RDI[6] = 0;
    in_RDI[7] = 0;
  }
  else {
    *in_RDI = in_ESI;
    in_RDI[1] = in_EDX;
    in_RDI[2] = in_ECX;
    in_RDI[3] = in_R8D;
    pvVar2 = operator_new__((ulong)uVar1 * 2);
    *(void **)(in_RDI + 6) = pvVar2;
  }
  return;
}

Assistant:

explicit CImg(const unsigned int size_x, const unsigned int size_y=1, const unsigned int size_z=1, const unsigned int size_c=1):
      _is_shared(false) {
      const unsigned int siz = size_x*size_y*size_z*size_c;
      if (siz) {
        _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
        try { _data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "CImg() : Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(size_x*size_y*size_z*size_c*sizeof(T)),size_x,size_y,size_z,size_c);
        }
      } else { _width = _height = _depth = _spectrum = 0; _data = 0; }
    }